

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_executor.hpp
# Opt level: O0

void __thiscall
asio::execution::detail::any_executor_base::
execute<asio::detail::binder1<helics::MessageTimer::addTimeToTimer(int,std::chrono::duration<long,std::ratio<1l,1000000000l>>)::__0,std::error_code>>
          (any_executor_base *this,
          binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:115:30),_std::error_code>
          *f)

{
  code *pcVar1;
  binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:115:30),_std::error_code>
  *in_RSI;
  long in_RDI;
  bad_executor ex;
  non_const_lvalue<asio::detail::binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:115:30),_std::error_code>_>
  f2;
  binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:115:30),_std::error_code>
  *in_stack_ffffffffffffff58;
  binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:115:30),_std::error_code>
  *in_stack_ffffffffffffff60;
  bad_executor *this_00;
  bad_executor local_78;
  allocator<void> *in_stack_ffffffffffffff90;
  binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:115:30),_std::error_code>
  *in_stack_ffffffffffffff98;
  executor_function *in_stack_ffffffffffffffa0;
  undefined1 local_30 [8];
  executor_function_view local_28;
  non_const_lvalue<asio::detail::binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:115:30),_std::error_code>_>
  local_18 [3];
  
  if (*(long *)(in_RDI + 0x20) == 0) {
    this_00 = &local_78;
    bad_executor::bad_executor(this_00);
    asio::detail::throw_exception<asio::execution::bad_executor>(this_00);
    bad_executor::~bad_executor((bad_executor *)0x5efd4f);
  }
  else if (*(long *)(*(long *)(in_RDI + 0x28) + 0x18) == 0) {
    pcVar1 = *(code **)(*(long *)(in_RDI + 0x28) + 0x10);
    asio::detail::
    binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:115:30),_std::error_code>
    ::binder1(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    asio::detail::executor_function::
    executor_function<asio::detail::binder1<helics::MessageTimer::addTimeToTimer(int,std::chrono::duration<long,std::ratio<1l,1000000000l>>)::__0,std::error_code>,std::allocator<void>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    (*pcVar1)(in_RDI,local_30);
    asio::detail::executor_function::~executor_function
              ((executor_function *)in_stack_ffffffffffffff60);
    asio::detail::
    binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:115:30),_std::error_code>
    ::~binder1((binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:115:30),_std::error_code>
                *)0x5efcf2);
  }
  else {
    asio::detail::
    non_const_lvalue<asio::detail::binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:115:30),_std::error_code>_>
    ::non_const_lvalue(local_18,in_RSI);
    pcVar1 = *(code **)(*(long *)(in_RDI + 0x28) + 0x18);
    asio::detail::executor_function_view::
    executor_function_view<asio::detail::binder1<helics::MessageTimer::addTimeToTimer(int,std::chrono::duration<long,std::ratio<1l,1000000000l>>)::__0,std::error_code>>
              (&local_28,local_18[0].value);
    (*pcVar1)(in_RDI,local_28.complete_,local_28.function_);
  }
  return;
}

Assistant:

void execute(F&& f) const
  {
    if (target_)
    {
      if (target_fns_->blocking_execute != 0)
      {
        asio::detail::non_const_lvalue<F> f2(f);
        target_fns_->blocking_execute(*this, function_view(f2.value));
      }
      else
      {
        target_fns_->execute(*this,
            function(static_cast<F&&>(f), std::allocator<void>()));
      }
    }
    else
    {
      bad_executor ex;
      asio::detail::throw_exception(ex);
    }
  }